

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportBuildFileGenerator::GetTargets
          (cmExportBuildFileGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  cmExportSet *pcVar1;
  pointer ppcVar2;
  
  pcVar1 = this->ExportSet;
  if (pcVar1 == (cmExportSet *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(targets,&this->Targets);
    return;
  }
  ppcVar2 = (pcVar1->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 !=
      (pcVar1->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(targets,&(*ppcVar2)->Target->Name);
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 !=
             (this->ExportSet->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator
::GetTargets(std::vector<std::string> &targets) const
{
  if (this->ExportSet)
    {
    for(std::vector<cmTargetExport*>::const_iterator
          tei = this->ExportSet->GetTargetExports()->begin();
          tei != this->ExportSet->GetTargetExports()->end(); ++tei)
      {
      targets.push_back((*tei)->Target->GetName());
      }
    return;
    }
  targets = this->Targets;
}